

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

int Str_MuxDelayEdge_rec(Str_Mux_t *pMux,int i)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)pMux->Edge[i].Fan;
  if (lVar2 < 1) {
    iVar1 = pMux->Edge[i].FanDel;
  }
  else {
    iVar1 = pMux->Id;
    Str_MuxDelayEdge_rec(pMux + (lVar2 - iVar1),0);
    Str_MuxDelayEdge_rec(pMux + (lVar2 - iVar1),1);
    iVar1 = Str_Delay3(pMux[lVar2 - iVar1].Edge[0].FanDel,pMux[lVar2 - iVar1].Edge[1].FanDel,
                       pMux[lVar2 - iVar1].Edge[2].FanDel,pMux[lVar2 - iVar1].nLutSize);
    pMux->Edge[i].FanDel = iVar1;
  }
  return iVar1;
}

Assistant:

int Str_MuxDelayEdge_rec( Str_Mux_t * pMux, int i )
{
    if ( pMux->Edge[i].Fan > 0 )
    {
        Str_Mux_t * pFanin = Str_MuxFanin( pMux, i );
        Str_MuxDelayEdge_rec( pFanin, 0 );
        Str_MuxDelayEdge_rec( pFanin, 1 );
        pMux->Edge[i].FanDel = Str_Delay3( pFanin->Edge[0].FanDel, pFanin->Edge[1].FanDel, pFanin->Edge[2].FanDel, pFanin->nLutSize );
    }
    return pMux->Edge[i].FanDel;
}